

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds04_best_bst.cpp
# Opt level: O1

int main(void)

{
  map_bst<int,_int,_std::less<int>_> bst;
  int k;
  map_bst<int,_int,_std::less<int>_> local_28;
  byte local_c [4];
  
  std::istream::operator>>((istream *)&std::cin,(int *)local_c);
  local_28.mRoot = (node *)0x0;
  local_28.mSize = 0;
  insert_recur(&local_28,1,(2 << (local_c[0] & 0x1f)) + -1);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_preorder(&local_28);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_inorder(&local_28);
  CP::map_bst<int,_int,_std::less<int>_>::print_key_postorder(&local_28);
  CP::map_bst<int,_int,_std::less<int>_>::~map_bst(&local_28);
  return 0;
}

Assistant:

int main() {
  int k;
  int n;
  std::cin >> k;
  n = (2 << k) - 1;
  CP::map_bst<int,int> bst;
  gen_best_bst(n,bst);
  bst.print_key_preorder();
  bst.print_key_inorder();
  bst.print_key_postorder();
}